

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAParameters.cpp
# Opt level: O0

bool __thiscall RSAParameters::deserialise(RSAParameters *this,ByteString *serialised)

{
  size_t sVar1;
  RSAParameters *this_00;
  unsigned_long inBitLen;
  RSAParameters *in_RDI;
  ByteString dLen;
  ByteString dE;
  ByteString *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ByteString *in_stack_ffffffffffffff90;
  undefined1 local_1;
  
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  sVar1 = ByteString::size((ByteString *)0x1505e4);
  if (sVar1 != 0) {
    this_00 = (RSAParameters *)ByteString::size((ByteString *)0x150600);
    if (this_00 != (RSAParameters *)0x0) {
      setE(this_00,in_stack_ffffffffffffff68);
      inBitLen = ByteString::long_val(in_stack_ffffffffffffff90);
      setBitLength(in_RDI,inBitLen);
      local_1 = true;
      goto LAB_0015068d;
    }
  }
  local_1 = false;
LAB_0015068d:
  ByteString::~ByteString((ByteString *)0x150697);
  ByteString::~ByteString((ByteString *)0x1506a1);
  return local_1;
}

Assistant:

bool RSAParameters::deserialise(ByteString& serialised)
{
	ByteString dE = ByteString::chainDeserialise(serialised);
	ByteString dLen = ByteString::chainDeserialise(serialised);

	if ((dE.size() == 0) ||
	    (dLen.size() == 0))
        {
		return false;
	}

	setE(dE);
	setBitLength(dLen.long_val());

        return true;
}